

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcCodeStream::~CTcCodeStream(CTcCodeStream *this)

{
  ulong uVar1;
  
  (this->super_CTcDataStream)._vptr_CTcDataStream = (_func_int **)&PTR__CTcCodeStream_00307de0;
  release_labels(this);
  for (uVar1 = 0; uVar1 < this->line_pages_alloc_; uVar1 = uVar1 + 1) {
    free(this->line_pages_[uVar1]);
  }
  free(this->line_pages_);
  CTcDataStream::~CTcDataStream(&this->super_CTcDataStream);
  return;
}

Assistant:

CTcCodeStream::~CTcCodeStream()
{
    size_t i;

    /* release all active labels */
    release_labels();

    /* delete the line records pages */
    for (i = 0 ; i < line_pages_alloc_ ; ++i)
        t3free(line_pages_[i]);

    /* delete the master list of pages */
    t3free(line_pages_);
}